

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_alloc.c
# Opt level: O0

Level * NewLevel(void)

{
  Level *Tree;
  Level *l;
  
  Tree = (Level *)malloc(0x118);
  if (Tree != (Level *)0x0) {
    Tree->AllTris = (Triangle *)0x0;
    Tree->AllEdges = (Edge *)0x0;
    Tree->AllMats = (Material *)0x0;
    Tree->AllVerts = (Vertex *)0x0;
    Tree->AllObjects = (Object *)0x0;
    Tree->AllObjectTypes = (ObjectType *)0x0;
    Tree->InitialState = (LevelState *)0x0;
    Tree->DoorShut = (ALLEGRO_BITMAP *)0x0;
    Tree->DoorOpen = (ALLEGRO_BITMAP *)0x0;
    (Tree->Door).CollectNoise = (ALLEGRO_SAMPLE *)0x0;
    SetupQuadTree((QuadTreeNode *)Tree,-0x10000,-0x10000,0x10000,0x10000);
    SetupQuadTree(&Tree->CollisionTree,-0x10000,-0x10000,0x10000,0x10000);
  }
  return Tree;
}

Assistant:

struct Level *NewLevel()
{
   struct Level *l = (struct Level *)malloc(sizeof(struct Level));

   if (l) {
      l->AllTris = NULL;
      l->AllEdges = NULL;
      l->AllMats = NULL;
      l->AllVerts = NULL;
      l->AllObjects = NULL;
      l->AllObjectTypes = NULL;
      l->InitialState = NULL;
      l->DoorOpen = l->DoorShut = NULL;
      l->Door.CollectNoise = NULL;

      SetupQuadTree(&l->DisplayTree, -65536, -65536, 65536, 65536);
      SetupQuadTree(&l->CollisionTree, -65536, -65536, 65536, 65536);
   }

   return l;
}